

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnknownHandleManager.cpp
# Opt level: O3

vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
* helics::getTargets(vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                     *__return_storage_ptr__,
                    unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>_>
                    *tmap,string *target)

{
  pair<helics::GlobalHandle,_unsigned_short> *__args;
  pointer *pppVar1;
  iterator __position;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
  _Var2;
  GlobalHandle GVar3;
  GlobalHandle extraout_RAX;
  type currentTarget;
  pair<std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>,_std::__detail::_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_false,_true>_>
  pVar4;
  
  (__return_storage_ptr__->
  super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
          ::equal_range((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_false>_>
                         *)tmap,target);
  _Var2._M_cur = (__node_type *)
                 pVar4.first.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
                 ._M_cur;
  GVar3._1_7_ = pVar4.first.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
                ._M_cur._1_7_;
  GVar3.fed_id.gid._0_1_ = _Var2._M_cur == (__node_type *)0x0;
  if ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
       )_Var2._M_cur !=
      pVar4.second.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
      ._M_cur.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
      && _Var2._M_cur != (__node_type *)0x0) {
    do {
      __args = (pair<helics::GlobalHandle,_unsigned_short> *)
               ((long)&((_Var2._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                       ._M_storage._M_storage + 0x20);
      __position._M_current =
           (__return_storage_ptr__->
           super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (__return_storage_ptr__->
          super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::pair<helics::GlobalHandle,unsigned_short>,std::allocator<std::pair<helics::GlobalHandle,unsigned_short>>>
        ::_M_realloc_insert<std::pair<helics::GlobalHandle,unsigned_short>const&>
                  ((vector<std::pair<helics::GlobalHandle,unsigned_short>,std::allocator<std::pair<helics::GlobalHandle,unsigned_short>>>
                    *)__return_storage_ptr__,__position,__args);
        GVar3 = extraout_RAX;
      }
      else {
        *(undefined4 *)&(__position._M_current)->second =
             *(undefined4 *)
              ((long)&((_Var2._M_cur)->
                      super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
                      ).
                      super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                      ._M_storage._M_storage + 0x28);
        GVar3 = __args->first;
        (__position._M_current)->first = GVar3;
        pppVar1 = &(__return_storage_ptr__->
                   super__Vector_base<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
        *pppVar1 = *pppVar1 + 1;
      }
      _Var2._M_cur = (__node_type *)((_Var2._M_cur)->super__Hash_node_base)._M_nxt;
    } while ((_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
              )_Var2._M_cur !=
             pVar4.second.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
             ._M_cur.
             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<helics::GlobalHandle,_unsigned_short>_>,_true>
            );
  }
  return (vector<std::pair<helics::GlobalHandle,_unsigned_short>,_std::allocator<std::pair<helics::GlobalHandle,_unsigned_short>_>_>
          *)GVar3;
}

Assistant:

static auto
    getTargets(const std::unordered_multimap<std::string, UnknownHandleManager::TargetInfo>& tmap,
               const std::string& target)
{
    std::vector<UnknownHandleManager::TargetInfo> targets;
    auto [firstTarget, lastTarget] = tmap.equal_range(target);
    if (firstTarget != tmap.end()) {
        auto currentTarget = firstTarget;
        while (currentTarget != lastTarget) {
            targets.push_back(currentTarget->second);
            ++currentTarget;
        }
    }
    return targets;
}